

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::OnIndirectLink(cmGraphVizWriter *this,cmLinkItem *depender,cmLinkItem *dependee)

{
  allocator<char> local_41;
  string local_40;
  cmLinkItem *local_20;
  cmLinkItem *dependee_local;
  cmLinkItem *depender_local;
  cmGraphVizWriter *this_local;
  
  local_20 = dependee;
  dependee_local = depender;
  depender_local = (cmLinkItem *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  VisitLink(this,depender,dependee,false,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void cmGraphVizWriter::OnIndirectLink(cmLinkItem const& depender,
                                      cmLinkItem const& dependee)
{
  this->VisitLink(depender, dependee, false);
}